

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_header_chop_u64(nng_msg *msg,uint64_t *val)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  
  sVar2 = nni_msg_header_len(msg);
  if (sVar2 < 8) {
    iVar1 = 3;
  }
  else {
    pvVar3 = nni_msg_header(msg);
    sVar2 = nni_msg_header_len(msg);
    *val = (ulong)*(byte *)((long)pvVar3 + (sVar2 - 1)) +
           ((ulong)*(byte *)((long)pvVar3 + (sVar2 - 2)) << 8 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 3)) << 0x10 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 4)) << 0x18 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 5)) << 0x20 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 6)) << 0x28 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 7)) << 0x30 |
           (ulong)*(byte *)((long)pvVar3 + (sVar2 - 8)) << 0x38);
    nni_msg_header_chop(msg,8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_msg_header_chop_u64(nng_msg *msg, uint64_t *val)
{
	uint8_t *header;
	uint64_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	header = nng_msg_header(msg);
	header += nng_msg_header_len(msg);
	header -= sizeof(v);
	NNI_GET64(header, v);
	*val = v;
	nni_msg_header_chop(msg, sizeof(*val));
	return (0);
}